

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

string * __thiscall re2::Prog::DumpByteMap_abi_cxx11_(string *__return_storage_ptr__,Prog *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  undefined8 in_R9;
  uint uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string local_50;
  
  paVar6 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar6;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = 0;
  do {
    iVar3 = (int)uVar4;
    uVar5 = iVar3 - 1;
    lVar2 = (long)iVar3;
    do {
      if (0xfe < lVar2) {
        uVar5 = 0xff;
        break;
      }
      uVar5 = uVar5 + 1;
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (this->bytemap_[lVar1] == this->bytemap_[iVar3]);
    StringPrintf_abi_cxx11_
              (&local_50,"[%02x-%02x] -> %d\n",uVar4,(ulong)uVar5,(ulong)this->bytemap_[iVar3],in_R9
               ,paVar6);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    uVar4 = (ulong)(uVar5 + 1);
    if (0xfe < (int)uVar5) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string Prog::DumpByteMap() {
  std::string map;
  for (int c = 0; c < 256; c++) {
    int b = bytemap_[c];
    int lo = c;
    while (c < 256-1 && bytemap_[c+1] == b)
      c++;
    int hi = c;
    map += StringPrintf("[%02x-%02x] -> %d\n", lo, hi, b);
  }
  return map;
}